

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O3

MRIStepCoupling MRIStepCoupling_MIStoMRI(ARKodeButcherTable B,int q,int p)

{
  uint uVar1;
  int iVar2;
  realtype *prVar3;
  realtype *prVar4;
  realtype ***ppprVar5;
  realtype **pprVar6;
  realtype **pprVar7;
  realtype *prVar8;
  bool bVar9;
  bool bVar10;
  MRISTEP_METHOD_TYPE MVar11;
  MRIStepCoupling pMVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  MRISTEP_METHOD_TYPE type;
  double dVar21;
  double dVar22;
  int local_44;
  
  if (B == (ARKodeButcherTable)0x0) {
    return (MRIStepCoupling)0x0;
  }
  prVar3 = B->c;
  dVar21 = ABS(*prVar3);
  uVar1 = B->stages;
  lVar19 = (long)(int)uVar1;
  if (0 < lVar19) {
    lVar15 = 0;
    do {
      dVar21 = dVar21 + ABS((*B->A)[lVar15]);
      lVar15 = lVar15 + 1;
    } while (lVar19 != lVar15);
  }
  if (2.220446049250313e-14 < dVar21) {
    return (MRIStepCoupling)0x0;
  }
  dVar21 = prVar3[lVar19 + -1];
  if (1.0000000000000222 < dVar21) {
    return (MRIStepCoupling)0x0;
  }
  if (1 < (int)uVar1) {
    lVar15 = 1;
    do {
      if (prVar3[lVar15] - prVar3[lVar15 + -1] < -2.220446049250313e-14) {
        return (MRIStepCoupling)0x0;
      }
      lVar15 = lVar15 + 1;
    } while (lVar19 != lVar15);
  }
  uVar18 = uVar1;
  if ((int)uVar1 < 1) {
    dVar21 = ABS(dVar21 + -1.0);
  }
  else {
    dVar22 = 0.0;
    lVar13 = 0;
    lVar15 = lVar19;
    lVar14 = 0;
    do {
      lVar16 = lVar14 + 1;
      if (lVar16 < lVar19) {
        lVar17 = 1;
        do {
          dVar22 = dVar22 + ABS(*(double *)((long)B->A[lVar14] + lVar17 * 8 + lVar13));
          lVar17 = lVar17 + 1;
        } while (lVar15 != lVar17);
      }
      lVar13 = lVar13 + 8;
      lVar15 = lVar15 + -1;
      lVar14 = lVar16;
    } while (lVar16 != lVar19);
    if (2.220446049250313e-14 < dVar22) {
      return (MRIStepCoupling)0x0;
    }
    dVar21 = ABS(dVar21 + -1.0);
    if (0 < (int)uVar1) {
      lVar15 = 0;
      bVar10 = 2.220446049250313e-14 < dVar21;
      do {
        bVar9 = true;
        if (ABS(B->A[lVar19 + -1][lVar15] - B->b[lVar15]) <= 2.220446049250313e-14) {
          bVar9 = bVar10;
        }
        lVar15 = lVar15 + 1;
        bVar10 = bVar9;
      } while (lVar19 != lVar15);
      if (bVar9) {
        uVar18 = uVar1 + 1;
      }
      if ((int)uVar1 < 1) {
        type = MRISTEP_EXPLICIT;
      }
      else {
        lVar14 = 0;
        lVar13 = 0;
        type = MRISTEP_EXPLICIT;
        lVar15 = lVar19;
        do {
          lVar16 = 0;
          do {
            MVar11 = MRISTEP_IMPLICIT;
            if (ABS(*(double *)((long)B->A[lVar13] + lVar16 * 8 + lVar14)) <= 2.220446049250313e-14)
            {
              MVar11 = type;
            }
            type = MVar11;
            lVar16 = lVar16 + 1;
          } while (lVar15 != lVar16);
          lVar13 = lVar13 + 1;
          lVar14 = lVar14 + 8;
          lVar15 = lVar15 + -1;
        } while (lVar13 != lVar19);
      }
      goto LAB_004ef7e7;
    }
  }
  bVar9 = 2.220446049250313e-14 < dVar21;
  if (bVar9) {
    uVar18 = uVar1 + 1;
  }
  type = MRISTEP_EXPLICIT;
LAB_004ef7e7:
  local_44 = uVar1 + 1;
  pMVar12 = MRIStepCoupling_Alloc(1,uVar18,type);
  if (pMVar12 == (MRIStepCoupling)0x0) {
    return (MRIStepCoupling)0x0;
  }
  pMVar12->q = q;
  pMVar12->p = p;
  iVar2 = B->stages;
  lVar19 = (long)iVar2;
  if (0 < lVar19) {
    prVar3 = B->c;
    prVar4 = pMVar12->c;
    lVar15 = 0;
    do {
      prVar4[lVar15] = prVar3[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar19 != lVar15);
  }
  if (bVar9) {
    pMVar12->c[(long)local_44 + -1] = 1.0;
  }
  ppprVar5 = (&pMVar12->W)[type != MRISTEP_EXPLICIT];
  if (0 < (int)uVar18) {
    pprVar6 = *ppprVar5;
    uVar20 = 0;
    do {
      memset(pprVar6[uVar20],0,(ulong)uVar18 * 8);
      uVar20 = uVar20 + 1;
    } while (uVar18 != uVar20);
  }
  if (1 < iVar2) {
    pprVar6 = B->A;
    pprVar7 = *ppprVar5;
    lVar15 = 1;
    do {
      prVar3 = pprVar6[lVar15 + -1];
      prVar4 = pprVar6[lVar15];
      prVar8 = pprVar7[lVar15];
      lVar14 = 0;
      do {
        prVar8[lVar14] = prVar4[lVar14] - prVar3[lVar14];
        lVar14 = lVar14 + 1;
      } while (lVar19 != lVar14);
      lVar15 = lVar15 + 1;
    } while (lVar15 != lVar19);
  }
  if (bVar9 && 0 < iVar2) {
    prVar3 = B->b;
    prVar4 = B->A[lVar19 + -1];
    prVar8 = (*ppprVar5)[(long)(int)uVar18 + -1];
    lVar15 = 0;
    do {
      prVar8[lVar15] = prVar3[lVar15] - prVar4[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar19 != lVar15);
    return pMVar12;
  }
  return pMVar12;
}

Assistant:

MRIStepCoupling MRIStepCoupling_MIStoMRI(ARKodeButcherTable B,
                                         int q, int p)
{
  int i, j, stages;
  booleantype padding;
  realtype Asum;
  realtype ***C;
  MRISTEP_METHOD_TYPE type;
  MRIStepCoupling MRIC;

  const realtype tol = RCONST(100.0) * UNIT_ROUNDOFF;

  /* Check that input table is non-NULL */
  if (!B) return(NULL);

  /* -----------------------------------
   * Check that the input table is valid
   * ----------------------------------- */

  /* First stage is just old solution */
  Asum = SUNRabs(B->c[0]);
  for (j=0; j<B->stages; j++)
    Asum += SUNRabs(B->A[0][j]);
  if (Asum > tol) return(NULL);

  /* Last stage exceeds 1 */
  if (B->c[B->stages-1] > ONE+tol) return(NULL);

  /* All stages are sorted */
  for (j=1; j<B->stages; j++)
    if ((B->c[j] - B->c[j-1]) < -tol) return(NULL);

  /* Each stage at most diagonally implicit */
  Asum = ZERO;
  for (i=0; i<B->stages; i++)
    for (j=i+1; j<B->stages; j++)
      Asum += SUNRabs(B->A[i][j]);
  if (Asum > tol) return(NULL);

  /* -----------------------------------------
   * determine whether the table needs padding
   * ----------------------------------------- */

  padding = SUNFALSE;

  /* Last stage time should equal 1 */
  if (SUNRabs(B->c[B->stages-1] - ONE) > tol)
    padding = SUNTRUE;

  /* Last row of A should equal b */
  for (j=0; j<B->stages; j++) {
    if (SUNRabs(B->A[B->stages-1][j] - B->b[j]) > tol)
      padding = SUNTRUE;
  }
  stages = (padding) ? B->stages+1 : B->stages;

  /* -------------------------
   * determine the method type
   * ------------------------- */

  /* Check if the table is strictly lower triangular (explicit) */
  type = MRISTEP_EXPLICIT;

  for (i=0; i<B->stages; i++)
    for (j=i; j<B->stages; j++)
      if (SUNRabs(B->A[i][j]) > tol)
        type = MRISTEP_IMPLICIT;

  /* ----------------------------
   * construct coupling structure
   * ---------------------------- */

  MRIC = MRIStepCoupling_Alloc(1, stages, type);
  if (!MRIC) return(NULL);

  /* Copy method/embedding orders */
  MRIC->q = q;
  MRIC->p = p;

  /* Copy abscissae, padding if needed */
  for (i=0; i<B->stages; i++)
    MRIC->c[i] = B->c[i];

  if (padding)
    MRIC->c[stages-1] = ONE;

  /* Construct the coupling table */
  if (type == MRISTEP_EXPLICIT)
    C = MRIC->W;
  else
    C = MRIC->G;

  /* First row is identically zero */
  for (i=0; i<stages; i++)
    for (j=0; j<stages; j++)
      C[0][i][j] = ZERO;

  /* Remaining rows = A(2:end,:) - A(1:end-1,:) */
  for (i=1; i<B->stages; i++)
    for (j=0; j<B->stages; j++)
      C[0][i][j] = B->A[i][j] - B->A[i-1][j];

  /* Padded row = b(:) - A(end,:) */
  if (padding)
    for (j=0; j<B->stages; j++)
      C[0][stages-1][j] = B->b[j] - B->A[B->stages-1][j];

  return(MRIC);
}